

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

DUMBFILE *
dumb_read_allfile(dumbfile_mem_status *filestate,BYTE *start,FileReader *reader,int lenhave,
                 int lenfull)

{
  int iVar1;
  undefined4 extraout_var;
  DUMBFILE *pDVar2;
  DUMBFILE_SYSTEM *in_stack_ffffffffffffffc0;
  BYTE *in_stack_ffffffffffffffc8;
  BYTE *mem;
  int lenfull_local;
  int lenhave_local;
  FileReader *reader_local;
  BYTE *start_local;
  dumbfile_mem_status *filestate_local;
  
  filestate->size = lenfull;
  filestate->offset = 0;
  if (lenhave < lenfull) {
    in_stack_ffffffffffffffc8 = (BYTE *)operator_new__((long)lenfull);
    memcpy(in_stack_ffffffffffffffc8,start,(long)lenhave);
    iVar1 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (reader,in_stack_ffffffffffffffc8 + lenhave,(long)(lenfull - lenhave));
    if (CONCAT44(extraout_var,iVar1) != (long)(lenfull - lenhave)) {
      if (in_stack_ffffffffffffffc8 != (BYTE *)0x0) {
        operator_delete__(in_stack_ffffffffffffffc8);
      }
      return (DUMBFILE *)0x0;
    }
    filestate->ptr = in_stack_ffffffffffffffc8;
  }
  else {
    filestate->ptr = start;
  }
  pDVar2 = dumbfile_open_ex(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  return pDVar2;
}

Assistant:

DUMBFILE *dumb_read_allfile(dumbfile_mem_status *filestate, BYTE *start, FileReader &reader, int lenhave, int lenfull)
{
	filestate->size = lenfull;
	filestate->offset = 0;
	if (lenhave >= lenfull)
		filestate->ptr = (BYTE *)start;
    else
    {
        BYTE *mem = new BYTE[lenfull];
        memcpy(mem, start, lenhave);
        if (reader.Read(mem + lenhave, lenfull - lenhave) != (lenfull - lenhave))
        {
            delete[] mem;
            return NULL;
        }
        filestate->ptr = mem;
    }
    return dumbfile_open_ex(filestate, &mem_dfs);
}